

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

char * token_name(int id)

{
  switch(id) {
  case 0x80:
    return "\'byte\'";
  case 0x81:
    return "\'else\'";
  case 0x82:
    return "\'if\'";
  case 0x83:
    return "\'return\'";
  case 0x84:
    return "\'void\'";
  case 0x85:
    return "\'word\'";
  case 0x86:
    return "identifier";
  case 0x87:
    return "numeric constant";
  case 0x88:
    return "\'==\'";
  case 0x89:
    return "\'!=\'";
  case 0x8a:
    return "\'<=\'";
  case 0x8b:
    return "\'>=\'";
  }
  if (id != -1) {
    token_name::single[1] = (char)id;
    return token_name::single;
  }
  return "end of file";
}

Assistant:

const char* token_name(int id)
{
    static char single[] = "' '";

    switch (id)
    {
        case EOF: return "end of file";

        case BYTE: return "'byte'";
        case ELSE: return "'else'";
        case IF:   return "'if'";
        case RETURN: return "'return'";
        case VOID: return "'void'";
        case WORD: return "'word'";

        case CONSTANT: return "numeric constant";
        case IDENTIFIER: return "identifier";

        case EQ_OP: return "'=='";
        case NE_OP: return "'!='";
        case LE_OP: return "'<='";
        case GE_OP: return "'>='";

        default:
            single[1] = id;
            return single;
    }
}